

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_util.c
# Opt level: O3

int psa_status_to_mbedtls
              (psa_status_t status,mbedtls_error_pair_t *local_translations,size_t local_errors_num,
              _func_int_psa_status_t *fallback_f)

{
  int iVar1;
  size_t sVar2;
  
  if (local_errors_num != 0) {
    sVar2 = 0;
    do {
      if (local_translations[sVar2].psa_status == status) {
        return (int)local_translations[sVar2].mbedtls_error;
      }
      sVar2 = sVar2 + 1;
    } while (local_errors_num != sVar2);
  }
  iVar1 = (*fallback_f)(status);
  return iVar1;
}

Assistant:

int psa_status_to_mbedtls(psa_status_t status,
                          const mbedtls_error_pair_t *local_translations,
                          size_t local_errors_num,
                          int (*fallback_f)(psa_status_t))
{
    for (size_t i = 0; i < local_errors_num; i++) {
        if (status == local_translations[i].psa_status) {
            return local_translations[i].mbedtls_error;
        }
    }
    return fallback_f(status);
}